

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bdecode.cpp
# Opt level: O3

void libtorrent::aux::escape_string(string *ret,char *str,int len)

{
  char *pcVar1;
  char *pcVar2;
  long lVar3;
  ulong uVar4;
  char tmp [3];
  char local_33 [3];
  
  uVar4 = (ulong)len;
  pcVar1 = str;
  if (0 < (long)uVar4 >> 2) {
    pcVar1 = str + (uVar4 & 0xfffffffffffffffc);
    lVar3 = ((long)uVar4 >> 2) + 1;
    pcVar2 = str + 3;
    do {
      if ((byte)(pcVar2[-3] + 0x81U) < 0xa1) {
        pcVar2 = pcVar2 + -3;
        goto LAB_00184e9e;
      }
      if ((byte)(pcVar2[-2] + 0x81U) < 0xa1) {
        pcVar2 = pcVar2 + -2;
        goto LAB_00184e9e;
      }
      if ((byte)(pcVar2[-1] + 0x81U) < 0xa1) {
        pcVar2 = pcVar2 + -1;
        goto LAB_00184e9e;
      }
      if ((byte)(*pcVar2 + 0x81U) < 0xa1) goto LAB_00184e9e;
      lVar3 = lVar3 + -1;
      pcVar2 = pcVar2 + 4;
    } while (1 < lVar3);
  }
  lVar3 = (long)(str + uVar4) - (long)pcVar1;
  if (lVar3 == 1) {
LAB_00184e8e:
    pcVar2 = pcVar1;
    if (0xa0 < (byte)(*pcVar1 + 0x81U)) goto LAB_00184ef0;
  }
  else if (lVar3 == 2) {
LAB_00184e68:
    pcVar2 = pcVar1;
    if (0xa0 < (byte)(*pcVar1 + 0x81U)) {
      pcVar1 = pcVar1 + 1;
      goto LAB_00184e8e;
    }
  }
  else {
    if (lVar3 != 3) goto LAB_00184ef0;
    pcVar2 = pcVar1;
    if (0xa0 < (byte)(*pcVar1 + 0x81U)) {
      pcVar1 = pcVar1 + 1;
      goto LAB_00184e68;
    }
  }
LAB_00184e9e:
  if (pcVar2 != str + uVar4) {
    if (0 < len) {
      uVar4 = 0;
      do {
        snprintf(local_33,3,"%02x",(ulong)(byte)str[uVar4]);
        ::std::__cxx11::string::append((char *)ret);
        uVar4 = uVar4 + 1;
      } while ((uint)len != uVar4);
    }
    return;
  }
LAB_00184ef0:
  ::std::__cxx11::string::_M_replace((ulong)ret,0,(char *)ret->_M_string_length,(ulong)str);
  return;
}

Assistant:

void escape_string(std::string& ret, char const* str, int len)
	{
		if (std::any_of(str, str + len, [](char const c) { return c < 32 || c >= 127; } ))
		{
			for (int i = 0; i < len; ++i)
			{
				char tmp[3];
				std::snprintf(tmp, sizeof(tmp), "%02x", std::uint8_t(str[i]));
				ret += tmp;
			}
		}
		else
		{
			ret.assign(str, std::size_t(len));
		}
	}